

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

Error __thiscall
asmjit::ZoneVectorBase::_reserve(ZoneVectorBase *this,ZoneHeap *heap,size_t sizeOfT,size_t n)

{
  uint8_t **ppuVar1;
  ulong *puVar2;
  Zone *pZVar3;
  Block *pBVar4;
  char cVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Error EVar8;
  ZoneHeap *pZVar9;
  ZoneHeap *__dest;
  ZoneHeap *extraout_RAX;
  Slot *pSVar10;
  sbyte sVar11;
  sbyte sVar12;
  ZoneHeap *pZVar13;
  Slot *pSVar14;
  Block *pBVar15;
  size_t extraout_RDX;
  ZoneHeap *sizeOfT_00;
  ZoneHeap *extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t sVar16;
  Slot *pSVar17;
  size_t extraout_RDX_03;
  ulong extraout_RDX_04;
  ZoneHeap *extraout_RDX_05;
  long extraout_RDX_06;
  Block *pBVar18;
  long extraout_RDX_07;
  ZoneVectorBase *unaff_RBX;
  ZoneHeap *unaff_RBP;
  ZoneHeap *pZVar19;
  uint uVar20;
  ZoneHeap *pZVar21;
  ZoneHeap *this_00;
  ZoneHeap *pZVar22;
  ulong in_R8;
  ulong uVar23;
  undefined1 *puVar24;
  undefined1 *puVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ZoneHeap *pZVar30;
  ulong uVar31;
  ZoneHeap *pZVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  size_t allocatedBytes;
  size_t sStack_120;
  ZoneHeap *pZStack_118;
  ZoneHeap *pZStack_110;
  ZoneHeap *pZStack_108;
  ZoneHeap *pZStack_f8;
  size_t asStack_f0 [2];
  ZoneHeap *pZStack_e0;
  ZoneHeap *pZStack_d8;
  ZoneHeap *pZStack_d0;
  undefined8 uStack_c8;
  ulong uStack_c0;
  uint uStack_b4;
  ZoneHeap *pZStack_b0;
  ZoneHeap *pZStack_a8;
  ZoneHeap *pZStack_a0;
  ZoneHeap *pZStack_98;
  ulong uStack_90;
  ZoneHeap *pZStack_88;
  ZoneHeap *pZStack_78;
  ZoneVectorBase *pZStack_68;
  ZoneHeap *pZStack_60;
  size_t sStack_58;
  code *pcStack_50;
  size_t local_40;
  ulong local_38;
  
  uVar31 = this->_capacity;
  pZVar19 = (ZoneHeap *)0x0;
  if (n <= uVar31) {
    return 0;
  }
  pZVar21 = (ZoneHeap *)(n * sizeOfT);
  if (pZVar21 < n) {
    return 1;
  }
  if (heap->_zone == (Zone *)0x0) {
    pcStack_50 = (code *)0x119377;
    _reserve();
    pZVar9 = (ZoneHeap *)this;
LAB_00119377:
    pcStack_50 = (code *)0x11937c;
    _reserve();
LAB_0011937c:
    pcStack_50 = (code *)0x119381;
    _reserve();
  }
  else {
    pcStack_50 = (code *)0x11928d;
    pZVar9 = (ZoneHeap *)ZoneHeap::_alloc(heap,(size_t)pZVar21,&local_38);
    if (pZVar9 == (ZoneHeap *)0x0) {
      return 1;
    }
    unaff_RBP = (ZoneHeap *)this->_data;
    sVar16 = this->_length;
    if (sVar16 != 0) {
      pcStack_50 = (code *)0x1192b9;
      pZVar21 = unaff_RBP;
      local_40 = sizeOfT;
      memcpy(pZVar9,unaff_RBP,sVar16 * sizeOfT);
      sVar16 = extraout_RDX;
      sizeOfT = local_40;
    }
    unaff_RBX = this;
    if (unaff_RBP == (ZoneHeap *)0x0) {
LAB_00119342:
      pZVar19 = (ZoneHeap *)0x0;
      this->_capacity = local_38 / sizeOfT;
      if (n <= local_38 / sizeOfT) {
        this->_data = pZVar9;
        return 0;
      }
      goto LAB_00119377;
    }
    if (heap->_zone == (Zone *)0x0) goto LAB_0011937c;
    uVar31 = uVar31 * sizeOfT;
    if (uVar31 != 0) {
      if (uVar31 < 0x201) {
        if (uVar31 < 0x81) {
          uVar31 = uVar31 + 0x1fffffffff >> 5;
        }
        else {
          uVar31 = (uVar31 + 0x3fffffff7f >> 6) + 4;
        }
        unaff_RBP->_zone = (Zone *)heap->_slots[uVar31 & 0xffffffff];
        heap->_slots[uVar31 & 0xffffffff] = (Slot *)unaff_RBP;
      }
      else {
        pcStack_50 = (code *)0x119314;
        pZVar21 = unaff_RBP;
        ZoneHeap::_releaseDynamic(heap,unaff_RBP,sVar16);
        uVar31 = sizeOfT;
      }
      goto LAB_00119342;
    }
  }
  pcStack_50 = _resize;
  _reserve();
  pZVar30 = (ZoneHeap *)pZVar9->_slots[0];
  pZStack_68 = unaff_RBX;
  pZStack_60 = heap;
  sStack_58 = n;
  pcStack_50 = (code *)sizeOfT;
  if (pZVar19 <= (ZoneHeap *)pZVar9->_slots[1]) {
LAB_001193a1:
    if (pZVar30 <= pZVar19 && (long)pZVar19 - (long)pZVar30 != 0) {
      pZStack_78 = (ZoneHeap *)0x1193be;
      memset((uint8_t **)((long)&pZVar9->_zone->_ptr + (long)pZVar30 * (long)sizeOfT_00),0,
             ((long)pZVar19 - (long)pZVar30) * (long)sizeOfT_00);
    }
    pZVar9->_slots[0] = (Slot *)pZVar19;
    return 0;
  }
  pZVar13 = (ZoneHeap *)((long)pZVar19 - (long)pZVar30);
  pZStack_78 = (ZoneHeap *)0x1193e1;
  pZVar22 = pZVar9;
  EVar8 = _grow((ZoneVectorBase *)pZVar9,pZVar21,(size_t)sizeOfT_00,(size_t)pZVar13);
  if (EVar8 != 0) {
    return EVar8;
  }
  if (pZVar19 <= (ZoneHeap *)pZVar9->_slots[1]) goto LAB_001193a1;
  pZStack_78 = (ZoneHeap *)ZoneBitVector::_resize;
  _resize();
  pZStack_a0 = pZVar19;
  pZStack_98 = pZVar30;
  uStack_90 = uVar31;
  pZStack_88 = pZVar9;
  pZStack_78 = unaff_RBP;
  if (pZVar13 < extraout_RDX_00) {
    uStack_c0 = 0x1196cc;
    ZoneBitVector::_resize();
    return 1;
  }
  pZVar19 = (ZoneHeap *)pZVar22->_slots[0];
  if (extraout_RDX_00 <= pZVar19) {
    if (((ulong)extraout_RDX_00 & 0x3f) != 0) {
      ppuVar1 = &pZVar22->_zone->_ptr + ((ulong)extraout_RDX_00 >> 6);
      *ppuVar1 = (uint8_t *)((ulong)*ppuVar1 & ~(-1L << (sbyte)((ulong)extraout_RDX_00 & 0x3f)));
    }
    goto LAB_001196b2;
  }
  pZVar9 = (ZoneHeap *)pZVar22->_zone;
  pZVar32 = sizeOfT_00;
  if (extraout_RDX_00 <= (ZoneHeap *)pZVar22->_slots[1]) {
LAB_0011957f:
    pZVar13 = (ZoneHeap *)((ulong)pZVar19 >> 6);
    uVar26 = (uint)extraout_RDX_00 & 0x3f;
    sVar11 = (sbyte)uVar26;
    pSVar17 = (Slot *)-(in_R8 & 0xff);
    pZVar19 = (ZoneHeap *)((ulong)pZVar19 & 0x3f);
    if (pZVar19 != (ZoneHeap *)0x0) {
      this_00 = (ZoneHeap *)((ulong)extraout_RDX_00 >> 6);
      sVar12 = 0;
      if ((pZVar13 == this_00) && (sVar12 = sVar11, uVar26 <= (uint)pZVar19)) {
        uStack_c0 = 0x1196e5;
        ZoneBitVector::_resize();
LAB_001196e5:
        uStack_c0 = 0x1196ea;
        ZoneBitVector::_resize();
        goto LAB_001196ea;
      }
      pZVar9->_slots[(long)((long)&pZVar13[-1]._dynamicBlocks + 7)] =
           (Slot *)((ulong)pZVar9->_slots[(long)((long)&pZVar13[-1]._dynamicBlocks + 7)] |
                   (long)pSVar17 << (sVar12 - (char)pZVar19 & 0x3fU));
      pZVar13 = (ZoneHeap *)((long)&pZVar13->_zone + 1);
    }
    auVar7 = _DAT_001329e0;
    auVar6 = _DAT_001329d0;
    uVar23 = (ulong)(extraout_RDX_00->_slots + 7) >> 6;
    lVar27 = uVar23 - 1;
    uVar31 = (ulong)((ZoneHeap *)(lVar27 * 0x40) == extraout_RDX_00);
    pZVar19 = (ZoneHeap *)(lVar27 - uVar31);
    if (pZVar13 <= pZVar19) {
      puVar24 = (undefined1 *)(uVar23 - uVar31);
      puVar25 = (undefined1 *)((long)&pZVar13->_zone + 1);
      if (puVar24 <= puVar25) {
        puVar24 = puVar25;
      }
      puVar25 = puVar24 + (-1 - (long)pZVar13);
      auVar33._8_4_ = (int)puVar25;
      auVar33._0_8_ = puVar25;
      auVar33._12_4_ = (int)((ulong)puVar25 >> 0x20);
      uVar31 = 0;
      auVar33 = auVar33 ^ _DAT_001329e0;
      do {
        auVar35._8_4_ = (int)uVar31;
        auVar35._0_8_ = uVar31;
        auVar35._12_4_ = (int)(uVar31 >> 0x20);
        auVar35 = (auVar35 | auVar6) ^ auVar7;
        if ((bool)(~(auVar35._4_4_ == auVar33._4_4_ && auVar33._0_4_ < auVar35._0_4_ ||
                    auVar33._4_4_ < auVar35._4_4_) & 1)) {
          pZVar9->_slots[(long)pZVar13->_slots + (uVar31 - 9)] = pSVar17;
        }
        if ((auVar35._12_4_ != auVar33._12_4_ || auVar35._8_4_ <= auVar33._8_4_) &&
            auVar35._12_4_ <= auVar33._12_4_) {
          pZVar9->_slots[(long)pZVar13->_slots + (uVar31 - 8)] = pSVar17;
        }
        uVar31 = uVar31 + 2;
      } while (((ulong)(puVar24 + (1 - (long)pZVar13)) & 0xfffffffffffffffe) != uVar31);
    }
    if (((ulong)extraout_RDX_00 & 0x3f) != 0) {
      puVar2 = (ulong *)((long)pZVar9 + (long)pZVar19 * 8);
      *puVar2 = *puVar2 & ~(-1L << sVar11);
    }
LAB_001196b2:
    pZVar22->_slots[0] = (Slot *)extraout_RDX_00;
    return 0;
  }
  pZVar32 = (ZoneHeap *)((ulong)((long)pZVar13->_slots + 0x37) & 0xffffffffffffffc0);
  if (pZVar32 < extraout_RDX_00) {
    return 1;
  }
  if (pZVar21->_zone == (Zone *)0x0) {
    uStack_c0 = 0x1196d8;
    pZVar13 = pZVar22;
    ZoneBitVector::_resize();
    __dest = extraout_RAX;
    sVar16 = extraout_RDX_03;
LAB_001196d8:
    this_00 = pZVar32;
  }
  else {
    uStack_b4 = (uint)in_R8;
    uStack_c0 = 0x119461;
    pZVar13 = pZVar21;
    __dest = (ZoneHeap *)ZoneHeap::_alloc(pZVar21,(ulong)pZVar32 >> 3,(size_t *)&pZStack_a8);
    in_R8 = (ulong)uStack_b4;
    if (__dest == (ZoneHeap *)0x0) {
      return 1;
    }
    sVar16 = extraout_RDX_01;
    this_00 = (ZoneHeap *)((long)pZStack_a8 * 8);
    if ((ZoneHeap *)((long)pZStack_a8 * 8) < pZStack_a8) goto LAB_001196d8;
  }
  if (pZVar19 != (ZoneHeap *)0x0) {
    uStack_c0 = 0x1194a8;
    pZVar13 = __dest;
    pZStack_b0 = this_00;
    memcpy(__dest,pZVar9,((ulong)(pZVar19->_slots + 7) >> 6) - 1);
    in_R8 = (ulong)uStack_b4;
    sVar16 = extraout_RDX_02;
    this_00 = pZStack_b0;
    pZVar32 = __dest;
  }
  pZVar30 = pZVar21;
  if (pZVar9 == (ZoneHeap *)0x0) {
LAB_00119578:
    pZVar22->_zone = (Zone *)__dest;
    pZVar22->_slots[1] = (Slot *)this_00;
    pZVar9 = __dest;
    goto LAB_0011957f;
  }
  if (pZVar21->_zone == (Zone *)0x0) goto LAB_001196e5;
  pSVar17 = pZVar22->_slots[1];
  if ((Slot *)0x7 < pSVar17) {
    if (pSVar17 < (Slot *)0x1008) {
      if (pSVar17 < (Slot *)0x408) {
        uVar26 = (uint)(((ulong)pSVar17 >> 3) + 0x1fffffffff >> 5);
      }
      else {
        uVar26 = (int)(((ulong)pSVar17 >> 3) + 0x3fffffff7f >> 6) + 4;
      }
      pZVar9->_zone = (Zone *)pZVar21->_slots[uVar26];
      pZVar21->_slots[uVar26] = (Slot *)pZVar9;
    }
    else {
      uStack_c0 = 0x119546;
      ZoneHeap::_releaseDynamic(pZVar21,pZVar9,sVar16);
      in_R8 = (ulong)uStack_b4;
      pZVar30 = this_00;
      pZVar32 = __dest;
    }
    goto LAB_00119578;
  }
LAB_001196ea:
  uStack_c0 = 0x1196ef;
  ZoneBitVector::_resize();
  pSVar10 = pZVar13->_slots[1];
  pSVar17 = (Slot *)0x80;
  if ((Slot *)0x7f < pSVar10) {
    if (pSVar10 < (Slot *)0x4000001) {
      pSVar17 = (Slot *)((long)pSVar10 * 2);
    }
    else {
      pSVar17 = pSVar10 + 0x800000;
    }
  }
  pSVar14 = (Slot *)((long)&pZVar13->_slots[0]->next + 1);
  if ((pSVar10 <= pSVar17) || (pSVar17 = pSVar14, pSVar10 < pSVar14)) {
    EVar8 = ZoneBitVector::_resize
                      ((ZoneBitVector *)pZVar13,this_00,(size_t)pSVar14,(size_t)pSVar17,
                       SUB81(extraout_RDX_04 & 0xffffffff,0));
    return EVar8;
  }
  uStack_c8 = 0x11973d;
  uStack_c0 = extraout_RDX_04 & 0xffffffff;
  ZoneBitVector::_append();
  if (extraout_RDX_05 <= this_00) {
    return (uint)(extraout_RDX_05 < this_00) + (uint)(extraout_RDX_05 < this_00) * 2;
  }
  if ((ZoneHeap *)pZVar13->_slots[0] < this_00) {
    pZStack_d0 = (ZoneHeap *)0x1198c9;
    ZoneBitVector::fill();
LAB_001198c9:
    pZStack_d0 = (ZoneHeap *)0x1198ce;
    ZoneBitVector::fill();
LAB_001198ce:
    pZStack_d0 = (ZoneHeap *)0x1198d3;
    ZoneBitVector::fill();
  }
  else {
    if ((ZoneHeap *)pZVar13->_slots[0] < extraout_RDX_05) goto LAB_001198c9;
    pZVar13 = (ZoneHeap *)pZVar13->_zone;
    if (pZVar13 == (ZoneHeap *)0x0) goto LAB_001198ce;
    cVar5 = (char)pSVar14;
    uVar31 = (ulong)this_00 >> 6;
    uVar20 = (uint)this_00 & 0x3f;
    this_00 = (ZoneHeap *)(ulong)uVar20;
    uVar23 = (ulong)extraout_RDX_05 >> 6;
    uVar26 = (uint)extraout_RDX_05 & 0x3f;
    sVar11 = (sbyte)uVar26;
    if (this_00 == (ZoneHeap *)0x0) {
LAB_001197dc:
      auVar7 = _DAT_001329e0;
      auVar6 = _DAT_001329d0;
      lVar27 = uVar23 - uVar31;
      if (uVar31 <= uVar23 && lVar27 != 0) {
        lVar28 = lVar27 + -1;
        auVar34._8_4_ = (int)lVar28;
        auVar34._0_8_ = lVar28;
        auVar34._12_4_ = (int)((ulong)lVar28 >> 0x20);
        uVar29 = 0;
        auVar34 = auVar34 ^ _DAT_001329e0;
        do {
          auVar36._8_4_ = (int)uVar29;
          auVar36._0_8_ = uVar29;
          auVar36._12_4_ = (int)(uVar29 >> 0x20);
          auVar33 = (auVar36 | auVar6) ^ auVar7;
          if ((bool)(~(auVar33._4_4_ == auVar34._4_4_ && auVar34._0_4_ < auVar33._0_4_ ||
                      auVar34._4_4_ < auVar33._4_4_) & 1)) {
            pZVar13->_slots[uVar31 + (uVar29 - 1)] = (Slot *)-((ulong)pSVar14 & 0xff);
          }
          if ((auVar33._12_4_ != auVar34._12_4_ || auVar33._8_4_ <= auVar34._8_4_) &&
              auVar33._12_4_ <= auVar34._12_4_) {
            pZVar13->_slots[uVar31 + uVar29] = (Slot *)-((ulong)pSVar14 & 0xff);
          }
          uVar29 = uVar29 + 2;
        } while ((lVar27 + 1U & 0xfffffffffffffffe) != uVar29);
      }
      if (((ulong)extraout_RDX_05 & 0x3f) != 0) {
        uVar31 = -1L << sVar11;
        if (cVar5 == '\0') {
          pZVar13->_slots[uVar23 - 1] = (Slot *)((ulong)pZVar13->_slots[uVar23 - 1] & uVar31);
        }
        else {
          pZVar13->_slots[uVar23 - 1] = (Slot *)((ulong)pZVar13->_slots[uVar23 - 1] | ~uVar31);
        }
      }
      return 0;
    }
    sVar12 = (sbyte)uVar20;
    if (uVar31 != uVar23) {
      if (cVar5 == '\0') {
        pZVar13->_slots[uVar31 - 1] =
             (Slot *)((ulong)pZVar13->_slots[uVar31 - 1] & ~(-1L << sVar12));
      }
      else {
        pZVar13->_slots[uVar31 - 1] = (Slot *)((ulong)pZVar13->_slots[uVar31 - 1] | -1L << sVar12);
      }
      uVar31 = uVar31 + 1;
      goto LAB_001197dc;
    }
    if (uVar20 < uVar26) {
      uVar23 = ~(-1L << (sVar11 - sVar12 & 0x3fU)) << sVar12;
      if (cVar5 == '\0') {
        pZVar13->_slots[uVar31 - 1] = (Slot *)((ulong)pZVar13->_slots[uVar31 - 1] & ~uVar23);
      }
      else {
        pZVar13->_slots[uVar31 - 1] = (Slot *)((ulong)pZVar13->_slots[uVar31 - 1] | uVar23);
      }
      return 0;
    }
  }
  pZStack_d0 = (ZoneHeap *)ZoneStackBase::_init;
  ZoneBitVector::fill();
  pZVar3 = pZVar13->_zone;
  pZStack_e0 = pZVar22;
  pZStack_d8 = pZVar32;
  pZStack_d0 = pZVar19;
  if (pZVar3 != (Zone *)0x0) {
    if ((Block *)pZVar13->_slots[0] != (Block *)0x0) {
      if (pZVar3->_ptr == (uint8_t *)0x0) {
        pZStack_f8 = (ZoneHeap *)0x119983;
        pZVar9 = this_00;
        pZVar22 = pZVar13;
        ZoneStackBase::_init();
        pZVar21 = (ZoneHeap *)pZVar22->_zone;
        pZStack_118 = pZVar13;
        pZStack_110 = pZVar30;
        pZStack_108 = this_00;
        pZStack_f8 = pZVar19;
        if (pZVar21 == (ZoneHeap *)0x0) {
          ZoneStackBase::_prepareBlock();
        }
        else {
          uVar31 = (ulong)pZVar9 & 0xffffffff;
          pSVar17 = pZVar22->_slots[uVar31];
          if (pSVar17[2].next != pSVar17[3].next) {
            if (pZVar21->_zone != (Zone *)0x0) {
              pSVar10 = (Slot *)ZoneHeap::_alloc(pZVar21,0x200,&sStack_120);
              if (pSVar10 == (Slot *)0x0) {
                return 1;
              }
              pSVar10[uVar31].next = (Slot *)0x0;
              pSVar10[(int)pZVar9 == 0].next = pSVar17;
              pSVar14 = (Slot *)((long)&pSVar10->next + extraout_RDX_07);
              pSVar10[2].next = pSVar14;
              pSVar10[3].next = pSVar14;
              pSVar17[uVar31].next = pSVar10;
              pZVar22->_slots[uVar31] = pSVar10;
              return 0;
            }
            goto LAB_00119a0e;
          }
        }
        ZoneStackBase::_prepareBlock();
LAB_00119a0e:
        ZoneStackBase::_prepareBlock();
        return 1;
      }
      pBVar4 = (Block *)pZVar13->_slots[0];
      pBVar18 = pZVar3[2]._block;
      do {
        pBVar15 = pBVar4;
        pBVar4 = pBVar15->next;
        pBVar15->prev = pBVar18;
        pZVar3[2]._block = pBVar15;
        pBVar18 = pBVar15;
      } while (pBVar4 != (Block *)0x0);
    }
    pZVar13->_zone = (Zone *)0x0;
    pZVar13->_slots[0] = (Slot *)0x0;
    pZVar13->_slots[1] = (Slot *)0x0;
  }
  EVar8 = 0;
  if (this_00 != (ZoneHeap *)0x0) {
    if (this_00->_zone == (Zone *)0x0) {
      pZStack_f8 = (ZoneHeap *)0x119977;
      ZoneStackBase::_init();
    }
    else {
      pZStack_f8 = (ZoneHeap *)0x119944;
      pSVar17 = (Slot *)ZoneHeap::_alloc(this_00,0x200,asStack_f0);
      if (pSVar17 != (Slot *)0x0) {
        pSVar10 = (Slot *)((long)&pSVar17->next + extraout_RDX_06);
        pSVar17->next = (Slot *)0x0;
        pSVar17[1].next = (Slot *)0x0;
        pSVar17[2].next = pSVar10;
        pSVar17[3].next = pSVar10;
        pZVar13->_zone = (Zone *)this_00;
        pZVar13->_slots[0] = pSVar17;
        pZVar13->_slots[1] = pSVar17;
        return 0;
      }
    }
    EVar8 = 1;
  }
  return EVar8;
}

Assistant:

Error ZoneVectorBase::_reserve(ZoneHeap* heap, size_t sizeOfT, size_t n) noexcept {
  size_t oldCapacity = _capacity;
  if (oldCapacity >= n) return kErrorOk;

  size_t nBytes = n * sizeOfT;
  if (ASMJIT_UNLIKELY(nBytes < n))
    return DebugUtils::errored(kErrorNoHeapMemory);

  size_t allocatedBytes;
  uint8_t* newData = static_cast<uint8_t*>(heap->alloc(nBytes, allocatedBytes));

  if (ASMJIT_UNLIKELY(!newData))
    return DebugUtils::errored(kErrorNoHeapMemory);

  void* oldData = _data;
  if (_length)
    ::memcpy(newData, oldData, _length * sizeOfT);

  if (oldData)
    heap->release(oldData, oldCapacity * sizeOfT);

  _capacity = allocatedBytes / sizeOfT;
  ASMJIT_ASSERT(_capacity >= n);

  _data = newData;
  return kErrorOk;
}